

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O3

void __thiscall ser::FieldsTable::RegisterField(FieldsTable *this,DataFieldInfo *dataFieldInfo)

{
  pointer pcVar1;
  const_iterator cVar2;
  mapped_type *this_00;
  long *plVar3;
  SerializationException *this_01;
  long *plVar4;
  SerializationException exception;
  string msg;
  string name;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  key_type local_40;
  
  pcVar1 = (dataFieldInfo->name_)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (dataFieldInfo->name_)._M_string_length);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
                  *)this,&local_40);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
              ::operator[](&this->data_,&local_40);
    DataFieldInfo::operator=(this_00,dataFieldInfo);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 "Error: trying to register the field ",&local_40);
  plVar3 = (long *)std::__cxx11::string::append(local_88);
  local_60 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_60 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_88 != (undefined1  [8])local_78) {
    operator_delete((void *)local_88);
  }
  local_88 = (undefined1  [8])&PTR__SerializationException_0018ea30;
  local_80._M_p = local_78 + 8;
  local_78._0_8_ = 0;
  local_78[8] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_80);
  this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_01,(SerializationException *)local_88);
  __cxa_throw(this_01,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

void FieldsTable::RegisterField(const DataFieldInfo& dataFieldInfo)
{
    const std::string name = dataFieldInfo.name();

    if (HasField(name))
    {
        // Field is already registered
        std::string msg = "Error: trying to register the field " + name
                        + ", which is already registered\n";
        SerializationException exception;
        exception.Init(msg);
        throw exception;
    }

    // Register field
    data_[name] = dataFieldInfo;
}